

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O3

ostream * add_options(ostream *o,MetaContainer meta)

{
  char *__s;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  ostream *poVar4;
  size_t sVar5;
  bool bVar6;
  char *pcVar7;
  MetaIterator __begin1;
  string sym_names;
  MetaIterator local_78;
  MetaIterator local_68;
  long *local_58 [2];
  long local_48 [2];
  char *local_38;
  
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"xyzabcdefghijklmnopqrstuvw","");
  if ((meta.str_ptr == (char *)0x0) || (*meta.str_ptr != ':')) {
    rtosc::Port::MetaIterator::MetaIterator(&local_78,meta.str_ptr);
  }
  else {
    rtosc::Port::MetaIterator::MetaIterator(&local_78,meta.str_ptr + 1);
  }
  local_68.title = (char *)CONCAT71(local_78.title._1_7_,local_78.title._0_1_);
  local_68.value = local_78.value;
  rtosc::Port::MetaIterator::MetaIterator(&local_78,(char *)0x0);
  pcVar7 = (char *)CONCAT71(local_78.title._1_7_,local_78.title._0_1_);
  bVar6 = false;
  if (local_68.title != pcVar7) {
    do {
      pcVar2 = strstr(local_68.title,"map ");
      bVar6 = (bool)(bVar6 | pcVar2 != (char *)0x0);
      rtosc::Port::MetaIterator::operator++(&local_68);
    } while (local_68.title != pcVar7);
  }
  if ((meta.str_ptr == (char *)0x0) || (*meta.str_ptr != ':')) {
    rtosc::Port::MetaIterator::MetaIterator(&local_78,meta.str_ptr);
  }
  else {
    rtosc::Port::MetaIterator::MetaIterator(&local_78,meta.str_ptr + 1);
  }
  local_68.title = (char *)CONCAT71(local_78.title._1_7_,local_78.title._0_1_);
  local_68.value = local_78.value;
  local_38 = meta.str_ptr;
  rtosc::Port::MetaIterator::MetaIterator(&local_78,(char *)0x0);
  pcVar7 = (char *)CONCAT71(local_78.title._1_7_,local_78.title._0_1_);
  if (local_68.title != pcVar7) {
    do {
      pcVar2 = local_68.title;
      iVar1 = strcmp(local_68.title,"documentation");
      if (iVar1 != 0) {
        iVar1 = strcmp(pcVar2,"parameter");
        if (iVar1 != 0) {
          iVar1 = strcmp(pcVar2,"max");
          if (iVar1 != 0) {
            iVar1 = strcmp(pcVar2,"min");
            if (iVar1 != 0) {
              printf("m.title = <%s>\n",pcVar2);
            }
          }
        }
      }
      rtosc::Port::MetaIterator::operator++(&local_68);
    } while (local_68.title != pcVar7);
  }
  if (bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>(o,"    <hints>\n",0xc);
    if ((local_38 == (char *)0x0) || (*local_38 != ':')) {
      rtosc::Port::MetaIterator::MetaIterator(&local_78,local_38);
    }
    else {
      rtosc::Port::MetaIterator::MetaIterator(&local_78,local_38 + 1);
    }
    pcVar7 = (char *)CONCAT71(local_78.title._1_7_,local_78.title._0_1_);
    local_68.value = local_78.value;
    local_68.title = pcVar7;
    rtosc::Port::MetaIterator::MetaIterator(&local_78,(char *)0x0);
    pcVar2 = (char *)CONCAT71(local_78.title._1_7_,local_78.title._0_1_);
    if (pcVar7 != pcVar2) {
      iVar1 = 0;
      do {
        __s = local_68.value;
        pcVar3 = strstr(pcVar7,"map ");
        if (pcVar3 != (char *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>(o,"      <point symbol=\"",0x15);
          local_78.title._0_1_ = *(undefined1 *)((long)local_58[0] + (long)iVar1);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(o,(char *)&local_78,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" value=\"",9);
          sVar5 = strlen(pcVar7 + 4);
          std::__ostream_insert<char,std::char_traits<char>>(o,pcVar7 + 4,sVar5);
          std::__ostream_insert<char,std::char_traits<char>>(o,"\">",2);
          if (__s == (char *)0x0) {
            std::ios::clear((int)o + (int)*(undefined8 *)(*(long *)o + -0x18));
          }
          else {
            sVar5 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>(o,__s,sVar5);
          }
          std::__ostream_insert<char,std::char_traits<char>>(o,"</point>\n",9);
          iVar1 = iVar1 + 1;
        }
        rtosc::Port::MetaIterator::operator++(&local_68);
        pcVar7 = local_68.title;
      } while (local_68.title != pcVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(o,"    </hints>\n",0xd);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  return o;
}

Assistant:

static ostream &add_options(ostream &o, Port::MetaContainer meta)
{
    string sym_names = "xyzabcdefghijklmnopqrstuvw";
    int sym_idx = 0;
    bool has_options = false;
    for(auto m:meta)
        if(strstr(m.title, "map "))
            has_options = true;
    for(auto m:meta)
        if(strcmp(m.title, "documentation") &&
                strcmp(m.title, "parameter") &&
                strcmp(m.title, "max") &&
                strcmp(m.title, "min"))
        printf("m.title = <%s>\n", m.title);

    if(!has_options)
        return o;

    o << "    <hints>\n";
    for(auto m:meta) {
        if(strstr(m.title, "map ")) {
            o << "      <point symbol=\"" << sym_names[sym_idx++] << "\" value=\"";
            o << m.title+4 << "\">" << m.value << "</point>\n";
        }
    }
    o << "    </hints>\n";

    return o;
}